

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int luaK_code(FuncState *fs,Instruction i)

{
  int iVar1;
  Proto *pPVar2;
  Instruction *pIVar3;
  int *piVar4;
  
  pPVar2 = fs->f;
  patchlistaux(fs,fs->jpc,fs->pc,0x7f,fs->pc);
  fs->jpc = -1;
  if (pPVar2->sizecode <= fs->pc) {
    pIVar3 = (Instruction *)
             luaM_growaux_(fs->ls->L,pPVar2->code,&pPVar2->sizecode,4,0x7fffffff,"opcodes");
    pPVar2->code = pIVar3;
  }
  pPVar2->code[fs->pc] = i;
  if (((byte)ravi_parser_debug & 2) != 0) {
    raviY_printf(fs,"[%d] %o\n",(ulong)(uint)fs->pc,i);
  }
  if (pPVar2->sizelineinfo <= fs->pc) {
    piVar4 = (int *)luaM_growaux_(fs->ls->L,pPVar2->lineinfo,&pPVar2->sizelineinfo,4,0x7fffffff,
                                  "opcodes");
    pPVar2->lineinfo = piVar4;
  }
  pPVar2->lineinfo[fs->pc] = fs->ls->lastline;
  iVar1 = fs->pc;
  fs->pc = iVar1 + 1;
  return iVar1;
}

Assistant:

static int luaK_code (FuncState *fs, Instruction i) {
  Proto *f = fs->f;
  dischargejpc(fs);  /* 'pc' will change */
  /* put new instruction in code array */
  luaM_growvector(fs->ls->L, f->code, fs->pc, f->sizecode, Instruction,
                  MAX_INT, "opcodes");
  f->code[fs->pc] = i;
  DEBUG_CODEGEN(raviY_printf(fs, "[%d] %o\n", fs->pc, i));
  /* save corresponding line information */
  luaM_growvector(fs->ls->L, f->lineinfo, fs->pc, f->sizelineinfo, int,
                  MAX_INT, "opcodes");
  f->lineinfo[fs->pc] = fs->ls->lastline;
  return fs->pc++;
}